

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_gen.cpp
# Opt level: O1

void __thiscall crnlib::corpus_gen::sort_blocks(corpus_gen *this,image_u8 *img)

{
  uint uVar1;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0 aVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  double dVar4;
  uint min_new_capacity;
  uint *puVar6;
  ulong uVar7;
  uint x_1;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint i;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uchar *puVar14;
  long lVar15;
  color_quad_u8 *pcVar16;
  uint x;
  long lVar17;
  uint y;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  vector<unsigned_int> remaining_blocks;
  int local_13c;
  ulong local_128;
  double local_120;
  vector<unsigned_int> block_indices1;
  vector<unsigned_int> block_indices0;
  vector<float> block_std_dev;
  image_u8 new_img;
  color_quad_u8 c [16];
  ulong uVar5;
  
  uVar1 = img->m_width;
  uVar10 = img->m_height;
  min_new_capacity = uVar1 >> 2;
  uVar5 = (ulong)min_new_capacity;
  uVar8 = (ulong)(uVar10 >> 2);
  uVar22 = (uVar10 >> 2) * min_new_capacity;
  console::printf("Sorting %u blocks...",(ulong)uVar22);
  block_std_dev.m_p = (float *)0x0;
  block_std_dev.m_size = 0;
  block_std_dev.m_capacity = 0;
  if (uVar22 != 0) {
    elemental_vector::increase_capacity
              ((elemental_vector *)&block_std_dev,uVar22,uVar22 == 1,4,(object_mover)0x0,false);
    memset(block_std_dev.m_p + (block_std_dev._8_8_ & 0xffffffff),0,
           (ulong)(uVar22 - block_std_dev.m_size) << 2);
    block_std_dev.m_size = uVar22;
  }
  if (3 < uVar10) {
    iVar25 = 0;
    local_128 = 0;
    do {
      if (3 < uVar1) {
        iVar21 = 0;
        uVar23 = 0;
        do {
          pcVar3 = img->m_pPixels;
          uVar11 = img->m_pitch;
          iVar9 = iVar25 * uVar11 + iVar21;
          puVar14 = &c[0].field_0.field_0.a;
          lVar15 = 0;
          do {
            lVar17 = 0;
            do {
              uVar18 = iVar9 + (int)lVar17;
              puVar14[lVar17 * 4 + -3] = pcVar3[uVar18].field_0.field_0.r;
              puVar14[lVar17 * 4 + -2] = pcVar3[uVar18].field_0.field_0.g;
              puVar14[lVar17 * 4 + -1] = pcVar3[uVar18].field_0.field_0.b;
              puVar14[lVar17 * 4] = pcVar3[uVar18].field_0.field_0.a;
              lVar17 = lVar17 + 1;
            } while (lVar17 != 4);
            lVar15 = lVar15 + 1;
            iVar9 = iVar9 + uVar11;
            puVar14 = puVar14 + 0x10;
          } while (lVar15 != 4);
          uVar11 = 0;
          local_120 = 0.0;
          do {
            dVar4 = image_utils::compute_std_dev(0x10,c,uVar11,1);
            local_120 = local_120 + dVar4;
            uVar11 = uVar11 + 1;
          } while (uVar11 != 3);
          block_std_dev.m_p[min_new_capacity * (int)local_128 + (int)uVar23] = (float)local_120;
          uVar23 = uVar23 + 1;
          iVar21 = iVar21 + 4;
        } while (uVar23 != uVar5);
      }
      local_128 = local_128 + 1;
      iVar25 = iVar25 + 4;
    } while (local_128 != uVar8);
  }
  block_indices0.m_p = (uint *)0x0;
  block_indices0.m_size = 0;
  block_indices0.m_capacity = 0;
  if (uVar22 == 0) {
    block_indices1.m_p = (uint *)0x0;
    block_indices1.m_size = 0;
    block_indices1.m_capacity = 0;
  }
  else {
    elemental_vector::increase_capacity
              ((elemental_vector *)&block_indices0,uVar22,uVar22 == 1,4,(object_mover)0x0,false);
    memset(block_indices0.m_p + (block_indices0._8_8_ & 0xffffffff),0,
           (ulong)(uVar22 - block_indices0.m_size) << 2);
    block_indices0.m_size = uVar22;
    block_indices1.m_p = (uint *)0x0;
    block_indices1.m_size = 0;
    block_indices1.m_capacity = 0;
    if (uVar22 != 0) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&block_indices1,uVar22,uVar22 == 1,4,(object_mover)0x0,false);
      memset(block_indices1.m_p + (block_indices1._8_8_ & 0xffffffff),0,
             (ulong)(uVar22 - block_indices1.m_size) << 2);
      block_indices1.m_size = uVar22;
    }
  }
  puVar6 = indirect_radix_sort<unsigned_int,float>
                     (uVar22,block_indices0.m_p,block_indices1.m_p,block_std_dev.m_p,0,4,true);
  c[0].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0xff000000;
  image<crnlib::color_quad<unsigned_char,_int>_>::image
            (&new_img,img->m_width,img->m_height,0xffffffff,c,0xf);
  if (uVar22 != 0) {
    uVar23 = 0;
    do {
      image<crnlib::color_quad<unsigned_char,_int>_>::unclipped_blit
                (&new_img,puVar6[uVar23] % min_new_capacity << 2,
                 puVar6[uVar23] / min_new_capacity << 2,4,4,(int)((uVar23 & 0xffffffff) % uVar5) * 4
                 ,(int)((uVar23 & 0xffffffff) / uVar5) << 2,img);
      uVar23 = uVar23 + 1;
    } while (uVar22 != uVar23);
  }
  remaining_blocks.m_p = (uint *)0x0;
  remaining_blocks.m_size = 0;
  remaining_blocks.m_capacity = 0;
  if (3 < uVar1) {
    elemental_vector::increase_capacity
              ((elemental_vector *)&remaining_blocks,min_new_capacity,min_new_capacity == 1,4,
               (object_mover)0x0,false);
    memset(remaining_blocks.m_p + (remaining_blocks._8_8_ & 0xffffffff),0,
           (ulong)(min_new_capacity - remaining_blocks.m_size) << 2);
    remaining_blocks.m_size = min_new_capacity;
  }
  console::printf("Arranging %u blocks...");
  if (3 < uVar10) {
    local_13c = 0;
    uVar23 = 0;
    do {
      console::printf("%u of %u",uVar23,uVar8);
      if (remaining_blocks.m_size != min_new_capacity) {
        if (remaining_blocks.m_size <= min_new_capacity) {
          if (remaining_blocks.m_capacity < min_new_capacity) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&remaining_blocks,min_new_capacity,
                       remaining_blocks.m_size + 1 == min_new_capacity,4,(object_mover)0x0,false);
          }
          memset(remaining_blocks.m_p + (remaining_blocks._8_8_ & 0xffffffff),0,
                 (ulong)(min_new_capacity - remaining_blocks.m_size) << 2);
        }
        remaining_blocks.m_size = min_new_capacity;
      }
      if (3 < uVar1) {
        uVar7 = 0;
        do {
          remaining_blocks.m_p[uVar7] = (uint)uVar7;
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      c[0xc].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[0xd].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[0xe].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[0xf].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[8].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[9].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[10].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[0xb].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[4].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[5].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[6].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[7].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[0].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[1].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[2].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[3].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      if (3 < uVar1) {
        iVar25 = 0;
        uVar7 = 0;
        do {
          if ((remaining_blocks._8_8_ & 0xffffffff) == 0) {
            uVar10 = 0;
          }
          else {
            uVar20 = 0;
            uVar24 = 0xffffffffffffffff;
            uVar10 = 0;
            do {
              iVar21 = local_13c * new_img.m_pitch + remaining_blocks.m_p[uVar20] * 4;
              puVar14 = &c[0].field_0.field_0.b;
              lVar15 = 0;
              uVar12 = 0;
              do {
                lVar17 = 0;
                do {
                  uVar22 = (int)lVar17 + iVar21;
                  iVar9 = (uint)new_img.m_pPixels[uVar22].field_0.field_0.r -
                          (uint)puVar14[lVar17 * 4 + -2];
                  iVar19 = (uint)new_img.m_pPixels[uVar22].field_0.field_0.g -
                           (uint)puVar14[lVar17 * 4 + -1];
                  iVar13 = (uint)new_img.m_pPixels[uVar22].field_0.field_0.b -
                           (uint)puVar14[lVar17 * 4];
                  uVar12 = uVar12 + (uint)(iVar13 * iVar13 + iVar19 * iVar19 + iVar9 * iVar9);
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 4);
                lVar15 = lVar15 + 1;
                iVar21 = iVar21 + new_img.m_pitch;
                puVar14 = puVar14 + 0x10;
              } while (lVar15 != 4);
              if (uVar12 < uVar24) {
                uVar24 = uVar12;
                uVar10 = (uint)uVar20;
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != (remaining_blocks._8_8_ & 0xffffffff));
          }
          uVar22 = remaining_blocks.m_p[uVar10];
          pcVar16 = c;
          lVar15 = 0;
          iVar21 = local_13c;
          do {
            lVar17 = 0;
            do {
              uVar18 = new_img.m_pitch * iVar21 + uVar22 * 4 + (int)lVar17;
              aVar2 = new_img.m_pPixels[uVar18].field_0.field_0;
              pcVar16[lVar17].field_0 =
                   (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)aVar2;
              pcVar3 = img->m_pPixels;
              uVar26 = img->m_pitch * iVar21 + iVar25 + (int)lVar17;
              pcVar3[uVar26].field_0.field_0.r = aVar2.r;
              pcVar3[uVar26].field_0.field_0.g = new_img.m_pPixels[uVar18].field_0.field_0.g;
              pcVar3[uVar26].field_0.field_0.b = new_img.m_pPixels[uVar18].field_0.field_0.b;
              pcVar3[uVar26].field_0.field_0.a = new_img.m_pPixels[uVar18].field_0.field_0.a;
              lVar17 = lVar17 + 1;
            } while (lVar17 != 4);
            lVar15 = lVar15 + 1;
            iVar21 = iVar21 + 1;
            pcVar16 = pcVar16 + 4;
          } while (lVar15 != 4);
          if (uVar10 + 1 < remaining_blocks.m_size) {
            remaining_blocks.m_p[uVar10] = remaining_blocks.m_p[remaining_blocks.m_size - 1];
          }
          if (remaining_blocks.m_size != 0) {
            remaining_blocks.m_size = remaining_blocks.m_size - 1;
          }
          uVar7 = uVar7 + 1;
          iVar25 = iVar25 + 4;
        } while (uVar7 != uVar5);
      }
      uVar23 = uVar23 + 1;
      local_13c = local_13c + 4;
    } while (uVar23 != uVar8);
  }
  if (remaining_blocks.m_p != (uint *)0x0) {
    crnlib_free(remaining_blocks.m_p);
  }
  if (new_img.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
    crnlib_free(new_img.m_pixel_buf.m_p);
  }
  if (block_indices1.m_p != (uint *)0x0) {
    crnlib_free(block_indices1.m_p);
  }
  if (block_indices0.m_p != (uint *)0x0) {
    crnlib_free(block_indices0.m_p);
  }
  if (block_std_dev.m_p != (float *)0x0) {
    crnlib_free(block_std_dev.m_p);
  }
  return;
}

Assistant:

void corpus_gen::sort_blocks(image_u8& img) {
  const uint num_blocks_x = img.get_width() / 4;
  const uint num_blocks_y = img.get_height() / 4;
  const uint total_blocks = num_blocks_x * num_blocks_y;

  console::printf("Sorting %u blocks...", total_blocks);

  crnlib::vector<float> block_std_dev(total_blocks);

  for (uint by = 0; by < num_blocks_y; by++) {
    for (uint bx = 0; bx < num_blocks_x; bx++) {
      color_quad_u8 c[4 * 4];

      for (uint y = 0; y < 4; y++)
        for (uint x = 0; x < 4; x++)
          c[x + y * 4] = img(bx * 4 + x, by * 4 + y);

      double std_dev = 0.0f;
      for (uint i = 0; i < 3; i++)
        std_dev += image_utils::compute_std_dev(16, c, i, 1);

      block_std_dev[bx + by * num_blocks_x] = (float)std_dev;
    }
  }

  crnlib::vector<uint> block_indices0(total_blocks);
  crnlib::vector<uint> block_indices1(total_blocks);

  const uint* pIndices = indirect_radix_sort(total_blocks, &block_indices0[0], &block_indices1[0], &block_std_dev[0], 0, sizeof(float), true);

  image_u8 new_img(img.get_width(), img.get_height());

  uint dst_block_index = 0;

  //float prev_std_dev = -999;
  for (uint i = 0; i < total_blocks; i++) {
    uint src_block_index = pIndices[i];

    //float std_dev = block_std_dev[src_block_index];
    //crnlib_ASSERT(std_dev >= prev_std_dev);
    //prev_std_dev = std_dev;

    uint src_block_x = src_block_index % num_blocks_x;
    uint src_block_y = src_block_index / num_blocks_x;

    uint dst_block_x = dst_block_index % num_blocks_x;
    uint dst_block_y = dst_block_index / num_blocks_x;

    new_img.unclipped_blit(src_block_x * 4, src_block_y * 4, 4, 4, dst_block_x * 4, dst_block_y * 4, img);

    dst_block_index++;
  }

#if 0      
      //new_img.swap(img);
#else
  crnlib::vector<uint> remaining_blocks(num_blocks_x);

  console::printf("Arranging %u blocks...", total_blocks);

  for (uint by = 0; by < num_blocks_y; by++) {
    console::printf("%u of %u", by, num_blocks_y);

    remaining_blocks.resize(num_blocks_x);
    for (uint i = 0; i < num_blocks_x; i++)
      remaining_blocks[i] = i;

    color_quad_u8 match_block[16];
    utils::zero_object(match_block);
    for (uint bx = 0; bx < num_blocks_x; bx++) {
      uint best_index = 0;

      uint64 best_error = cUINT64_MAX;

      for (uint i = 0; i < remaining_blocks.size(); i++) {
        uint src_block_index = remaining_blocks[i];

        uint64 error = 0;
        for (uint y = 0; y < 4; y++) {
          for (uint x = 0; x < 4; x++) {
            const color_quad_u8& c = new_img(src_block_index * 4 + x, by * 4 + y);
            error += color::elucidian_distance(c, match_block[x + y * 4], false);
          }
        }

        if (error < best_error) {
          best_error = error;
          best_index = i;
        }
      }

      uint src_block_index = remaining_blocks[best_index];

      for (uint y = 0; y < 4; y++) {
        for (uint x = 0; x < 4; x++) {
          const color_quad_u8& c = new_img(src_block_index * 4 + x, by * 4 + y);
          match_block[x + y * 4] = c;

          img(bx * 4 + x, by * 4 + y) = c;
        }
      }

      remaining_blocks.erase_unordered(best_index);
    }
  }
#endif
}